

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  ulong *puVar1;
  long *plVar2;
  byte bVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  exr_result_t eVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong ni;
  char *pcVar14;
  code *pcVar15;
  exr_const_context_t_conflict pctxt;
  uint uVar16;
  byte *pbVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  byte *in;
  byte *pbVar26;
  uint uVar27;
  bool bVar28;
  int iVar29;
  int iVar31;
  double dVar30;
  long lVar32;
  undefined1 auVar33 [16];
  uint64_t offset [59];
  size_t codeCount [59];
  uint64_t base [59];
  long alStackY_407b8 [180];
  long alStackY_40218 [32576];
  ulong local_800;
  ulong local_7b0;
  double local_7a8;
  long alStack_7a0 [59];
  long local_5c8;
  int local_5c0 [118];
  ulong local_3e8 [60];
  ulong local_208 [59];
  ulong uVar22;
  
  if (decode == (exr_decode_pipeline_t *)0x0) {
    pctxt = (exr_const_context_t_conflict)0x0;
  }
  else {
    pctxt = decode->context;
  }
  if (nCompressed < 0x14) {
    iVar6 = (uint)(nRaw != 0) * 3;
  }
  else {
    iVar6 = 3;
    if (sparebytes == 0xc0008) {
      uVar11 = *(uint *)compressed;
      uVar19 = (ulong)uVar11;
      uVar13 = *(uint *)(compressed + 4);
      uVar21 = (ulong)uVar13;
      iVar6 = 0x17;
      if (uVar21 < 0x10001 && uVar19 < 0x10001) {
        ni = (ulong)*(uint *)(compressed + 0xc);
        uVar23 = ni + 7 >> 3;
        if (nCompressed < uVar23 + 0x14) {
          iVar6 = 1;
        }
        else {
          in = compressed + 0x14;
          if (*(uint *)(compressed + 0xc) < 0x81) {
            pbVar26 = (byte *)(nCompressed - 0x14);
            uVar16 = 0;
            memset(spare,0,0xc0008);
            pbVar17 = in;
            if (uVar11 <= uVar13) {
              uVar23 = 0;
              do {
                if (uVar16 < 6) {
                  if (pbVar26 <= pbVar17 + -(long)in) goto LAB_0010cb77;
                  bVar24 = *pbVar17;
                  pbVar17 = pbVar17 + 1;
                  uVar23 = uVar23 << 8 | (ulong)bVar24;
                  uVar16 = uVar16 | 8;
                }
                uVar27 = uVar16 - 6;
                uVar20 = (uint)(uVar23 >> ((byte)uVar27 & 0x3f)) & 0x3f;
                uVar9 = (ulong)uVar20;
                *(ulong *)((long)spare + uVar19 * 8) = uVar9;
                if (uVar9 == 0x3f) {
                  if (uVar27 < 8) {
                    if (pbVar26 <= pbVar17 + -(long)in) goto LAB_0010cb77;
                    bVar24 = *pbVar17;
                    pbVar17 = pbVar17 + 1;
                    uVar23 = uVar23 << 8 | (ulong)bVar24;
                    uVar27 = uVar16 + 2;
                  }
                  uVar16 = uVar27 - 8;
                  uVar9 = uVar23 >> ((byte)uVar16 & 0x3f) & 0xff;
                  if (uVar21 + 1 < uVar19 + uVar9 + 6) goto LAB_0010cb77;
                  lVar8 = uVar9 + 6;
                  uVar9 = uVar19;
                  do {
                    uVar19 = (ulong)((int)uVar9 + 1);
                    *(undefined8 *)((long)spare + uVar9 * 8) = 0;
                    lVar8 = lVar8 + -1;
                    uVar9 = uVar19;
                  } while (lVar8 != 0);
                }
                else {
                  uVar16 = uVar27;
                  if (uVar20 < 0x3b) {
                    uVar19 = (ulong)((int)uVar19 + 1);
                  }
                  else {
                    if (uVar21 + 1 < (uVar19 + uVar9) - 0x39) goto LAB_0010cb77;
                    lVar8 = uVar9 - 0x39;
                    uVar9 = uVar19;
                    do {
                      uVar19 = (ulong)((int)uVar9 + 1);
                      *(undefined8 *)((long)spare + uVar9 * 8) = 0;
                      lVar8 = lVar8 + -1;
                      uVar9 = uVar19;
                    } while (lVar8 != 0);
                  }
                }
              } while ((uint)uVar19 <= uVar13);
            }
            pbVar26 = in + ((long)pbVar26 - (long)pbVar17);
            hufCanonicalCodeTable((uint64_t *)spare);
            in = pbVar17;
LAB_0010cb77:
            iVar6 = 0x17;
            if (ni <= (ulong)((long)pbVar26 << 3)) {
              iVar6 = hufBuildDecTable(pctxt,(uint64_t *)spare,uVar11,uVar13,
                                       (HufDec *)((long)spare + 0x80008));
              if (iVar6 == 0) {
                iVar6 = hufDecode((uint64_t *)spare,(HufDec *)((long)spare + 0x80008),in,ni,uVar13,
                                  nRaw,raw);
              }
              if (pctxt == (exr_const_context_t_conflict)0x0) {
                pcVar15 = internal_exr_free;
              }
              else {
                pcVar15 = pctxt->free_fn;
              }
              lVar8 = 0;
              do {
                pvVar4 = *(void **)((long)spare + lVar8 + 0x80010);
                if (pvVar4 != (void *)0x0) {
                  (*pcVar15)(pvVar4);
                  *(undefined8 *)((long)spare + lVar8 + 0x80010) = 0;
                }
                lVar8 = lVar8 + 0x10;
              } while (lVar8 != 0x40000);
            }
          }
          else {
            *(uint *)spare = uVar13;
            *(undefined4 *)((long)spare + 4) = 0;
            *(undefined2 *)((long)spare + 8) = 0xff;
            uVar16 = 0;
            memset(&local_5c8,0,0x1d8);
            memset(local_208,0xff,0x1d8);
            memset(&local_7a8,0,0x1d8);
            if (uVar13 < uVar11) {
              uVar25 = 0xff;
              local_800 = 0;
            }
            else {
              uVar25 = 0xff;
              local_800 = 0;
              uVar10 = 0;
              pbVar17 = in;
              uVar9 = uVar19;
              do {
                if (compressed + nCompressed <= pbVar17) {
LAB_0010cd8c:
                  if (pctxt == (exr_const_context_t_conflict)0x0) {
                    return 0x17;
                  }
                  pcVar14 = "Error decoding Huffman table (Truncated table data).";
                  goto LAB_0010d06a;
                }
                uVar27 = uVar16;
                if ((int)uVar16 < 6) {
                  do {
                    bVar24 = *pbVar17;
                    pbVar17 = pbVar17 + 1;
                    uVar10 = uVar10 << 8 | (ulong)bVar24;
                    uVar27 = uVar16 + 8;
                    bVar28 = (int)uVar16 < -2;
                    uVar16 = uVar27;
                  } while (bVar28);
                }
                uVar16 = uVar27 - 6;
                uVar20 = (uint)(uVar10 >> ((byte)uVar16 & 0x3f)) & 0x3f;
                uVar22 = (ulong)uVar20;
                if (uVar22 < 0x3b) {
                  if (uVar22 != 0) {
                    if (uVar20 < (uint)uVar25) {
                      *(char *)((long)spare + 8) = (char)uVar20;
                      uVar25 = uVar22;
                    }
                    uVar27 = (uint)(byte)local_800;
                    if (uVar27 < uVar20) {
                      *(char *)((long)spare + 9) = (char)uVar20;
                      local_800 = uVar22;
                    }
                    (&local_5c8)[uVar22] = (&local_5c8)[uVar22] + 1;
                    goto LAB_0010ca15;
                  }
                }
                else {
                  if (uVar20 == 0x3f) {
                    if (compressed + nCompressed <= pbVar17) goto LAB_0010cd8c;
                    if (uVar16 < 8) {
                      uVar16 = uVar27 + 2;
                      uVar10 = uVar10 << 8 | (ulong)*pbVar17;
                      pbVar17 = pbVar17 + 1;
                    }
                    uVar16 = uVar16 - 8;
                    uVar9 = uVar9 + (uVar10 >> ((byte)uVar16 & 0x3f) & 0xff) + 5;
                  }
                  else {
                    uVar9 = (uVar9 + uVar22) - 0x3a;
                  }
LAB_0010ca15:
                  if (uVar21 < uVar9) {
                    if (pctxt == (exr_const_context_t_conflict)0x0) {
                      return 0x17;
                    }
                    pcVar14 = "Error decoding Huffman table (Run beyond end of table).";
                    goto LAB_0010d06a;
                  }
                }
                bVar28 = uVar9 < uVar21;
                uVar9 = uVar9 + 1;
              } while (bVar28);
            }
            bVar24 = (byte)uVar25;
            iVar29 = 0;
            iVar31 = 0;
            lVar8 = 0;
            do {
              iVar29 = iVar29 + (int)(&local_5c8)[lVar8];
              iVar31 = iVar31 + local_5c0[lVar8 * 2];
              lVar8 = lVar8 + 2;
            } while (lVar8 != 0x3a);
            *(int *)((long)spare + 4) = iVar31 + iVar29;
            if ((uint)(iVar31 + iVar29) < 0x10002) {
              if (bVar24 <= (byte)local_800) {
                local_7b0 = (ulong)((byte)local_800 + 1);
                lVar8 = local_800 - uVar25;
                uVar9 = uVar25;
                do {
                  lVar12 = (&local_5c8)[uVar9];
                  auVar33._8_4_ = (int)((ulong)lVar12 >> 0x20);
                  auVar33._0_8_ = lVar12;
                  auVar33._12_4_ = 0x45300000;
                  (&local_7a8)[uVar9] =
                       (double)(2L << ((byte)lVar8 & 0x3f)) *
                       ((auVar33._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
                  uVar9 = uVar9 + 1;
                  bVar28 = lVar8 != 0;
                  lVar8 = lVar8 + -1;
                  uVar10 = uVar25;
                } while (bVar28);
                do {
                  dVar30 = 0.0;
                  for (uVar9 = uVar10; uVar9 < local_800; uVar9 = uVar9 + 1) {
                    dVar30 = dVar30 + (&local_7a8)[uVar9 + 1];
                  }
                  uVar9 = uVar10 + 1;
                  dVar30 = ceil(dVar30 / (double)(2L << ((byte)local_800 - (char)uVar10 & 0x3f)));
                  local_208[uVar10] =
                       (long)(dVar30 - 9.223372036854776e+18) & (long)dVar30 >> 0x3f | (long)dVar30;
                  uVar10 = uVar9;
                } while (uVar9 != local_7b0);
              }
              (&local_7a8)[local_800] = 0.0;
              if (bVar24 < (byte)local_800) {
                uVar10 = 0;
                uVar9 = local_800;
                do {
                  uVar10 = uVar10 + (&local_5c8)[uVar9];
                  (&local_7b0)[uVar9] = uVar10;
                  uVar9 = uVar9 - 1;
                } while ((long)uVar25 < (long)uVar9);
              }
              memset(local_3e8,0xff,0x1d8);
              if (bVar24 <= (byte)local_800) {
                uVar9 = (ulong)(uint)((int)uVar25 * 8);
                memcpy((void *)((long)local_3e8 + uVar9),(void *)((long)&local_7a8 + uVar9),
                       (ulong)((uint)(byte)local_800 - (int)uVar25) * 8 + 8);
              }
              if (uVar11 <= uVar13) {
                uVar11 = 0;
                uVar9 = 0;
                do {
                  uVar13 = uVar11;
                  if ((int)uVar11 < 6) {
                    do {
                      bVar3 = *in;
                      in = in + 1;
                      uVar9 = uVar9 << 8 | (ulong)bVar3;
                      uVar13 = uVar11 + 8;
                      bVar28 = (int)uVar11 < -2;
                      uVar11 = uVar13;
                    } while (bVar28);
                  }
                  uVar11 = uVar13 - 6;
                  uVar16 = (uint)(uVar9 >> ((byte)uVar11 & 0x3f)) & 0x3f;
                  uVar10 = (ulong)uVar16;
                  if (uVar10 < 0x3b) {
                    if (uVar10 != 0) {
                      uVar22 = local_208[uVar10 - 0x3c];
                      if (*(uint *)((long)spare + 4) <= uVar22) {
                        if (pctxt == (exr_const_context_t_conflict)0x0) {
                          return 0x17;
                        }
                        pcVar14 = "Huffman decode error (Invalid symbol in header)";
                        goto LAB_0010d06a;
                      }
                      *(int *)((long)spare + uVar22 * 4 + 0xc) = (int)uVar19;
                      local_208[uVar10 - 0x3c] = uVar22 + 1;
                    }
                  }
                  else if (uVar16 == 0x3f) {
                    if (uVar11 < 8) {
                      uVar11 = uVar13 + 2;
                      uVar9 = uVar9 << 8 | (ulong)*in;
                      in = in + 1;
                    }
                    uVar11 = uVar11 - 8;
                    uVar19 = uVar19 + (uVar9 >> ((byte)uVar11 & 0x3f) & 0xff) + 5;
                  }
                  else {
                    uVar19 = (uVar19 + uVar10) - 0x3a;
                  }
                  bVar28 = uVar19 < uVar21;
                  uVar19 = uVar19 + 1;
                } while (bVar28);
              }
              lVar12 = 0x40;
              lVar8 = 0x40010;
              do {
                lVar18 = *(long *)((long)alStackY_40218 + lVar8) << ((byte)lVar12 & 0x3f);
                if (*(long *)((long)alStackY_40218 + lVar8) == -1) {
                  lVar18 = -1;
                }
                *(long *)((long)spare + lVar8) = lVar18;
                lVar12 = lVar12 + -1;
                lVar8 = lVar8 + 8;
              } while (lVar12 != 5);
              *(undefined8 *)((long)spare + 0x401e8) = 0;
              lVar8 = *(long *)((long)spare + 0x40010);
              *(long *)((long)spare + 0x401f0) = (long)local_7a8 - lVar8;
              lVar18 = 1;
              lVar32 = 2;
              lVar12 = 0x8003;
              do {
                lVar5 = alStackY_407b8[lVar12 + 1];
                puVar1 = (ulong *)((long)spare + lVar12 * 8);
                uVar19 = puVar1[1];
                plVar2 = (long *)((long)spare + lVar12 * 8 + 0x1e0);
                *plVar2 = alStackY_407b8[lVar12] - (*puVar1 >> 0x40 - lVar18);
                plVar2[1] = lVar5 - (uVar19 >> 0x40 - lVar32);
                lVar18 = lVar18 + 2;
                lVar32 = lVar32 + 2;
                lVar12 = lVar12 + 2;
              } while (lVar12 != 0x803d);
              lVar12 = 0;
              do {
                *(undefined4 *)((long)spare + lVar12 * 4 + 0x403c8) = 0xffff;
                *(undefined1 *)((long)spare + lVar12 + 0x443c8) = 0;
                if (bVar24 <= (byte)local_800) {
                  uVar19 = uVar25;
                  do {
                    if (*(ulong *)((long)spare + uVar19 * 8 + 0x40010) <= (ulong)(lVar12 << 0x34)) {
                      *(char *)((long)spare + lVar12 + 0x443c8) = (char)uVar19;
                      uVar19 = ((ulong)(lVar12 << 0x34) >> (-(char)uVar19 & 0x3fU)) +
                               *(long *)((long)spare + uVar19 * 8 + 0x401f0);
                      if (*(uint *)((long)spare + 4) <= uVar19) {
                        if (pctxt == (exr_const_context_t_conflict)0x0) {
                          return 0x17;
                        }
                        pcVar14 = "Huffman decode error (Overrun)";
                        goto LAB_0010d06a;
                      }
                      *(undefined4 *)((long)spare + lVar12 * 4 + 0x403c8) =
                           *(undefined4 *)((long)spare + uVar19 * 4 + 0xc);
                      break;
                    }
                    uVar19 = uVar19 + 1;
                  } while (local_800 + 1 != uVar19);
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0x1000);
              uVar19 = 0xd;
              do {
                uVar11 = (int)uVar19 - 1;
                uVar19 = (ulong)uVar11;
                lVar12 = *(long *)((long)spare + uVar19 * 8 + 0x40010);
                if (lVar12 != -1) break;
                lVar12 = lVar8;
              } while (1 < uVar11);
              *(long *)((long)spare + 0x453c8) = lVar12;
              iVar6 = 1;
              if (in + (uVar23 - (long)compressed) <= nCompressed) {
                eVar7 = fasthuf_decode(pctxt,(FastHufDecoder *)spare,in,ni,raw,nRaw);
                return eVar7;
              }
            }
            else if (pctxt != (exr_const_context_t_conflict)0x0) {
              pcVar14 = "Error decoding Huffman table (Too many symbols).";
LAB_0010d06a:
              iVar6 = 0x17;
              (*pctxt->print_error)(pctxt,0x17,pcVar14);
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t            im, iM, nBits;
    uint64_t            nBytes;
    const uint8_t*      ptr;
    exr_result_t        rv;
    exr_const_context_t pctxt            = NULL;
    const uint64_t      hufInfoBlockSize = 5 * sizeof (uint32_t);

    if (decode) pctxt = decode->context;
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (
            pctxt, fhd, &ptr, nCompressed - hufInfoBlockSize, im, iM, (int) iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ((uint64_t) (ptr - compressed) + nBytes > nCompressed)
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, nRaw);
        }
    }
    else
    {
        uint64_t* freq  = (uint64_t*) spare;
        HufDec*   hdec  = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (pctxt, freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (pctxt, hdec);
    }
    return rv;
}